

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

int mbedtls_des_self_test(int verbose)

{
  uchar auVar1 [8];
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined8 uVar5;
  uchar tmp [8];
  uchar iv [8];
  uchar prv [8];
  uchar buf [8];
  mbedtls_des3_context ctx3;
  mbedtls_des_context ctx;
  int ret;
  int v;
  int u;
  int j;
  int i;
  int verbose_local;
  
  ctx.sk[0x1e] = 0;
  mbedtls_des_init((mbedtls_des_context *)(ctx3.sk + 0x5e));
  mbedtls_des3_init((mbedtls_des3_context *)(buf + 4));
  for (u = 0; u < 6; u = u + 1) {
    iVar2 = u >> 1;
    uVar3 = u & 1;
    if (verbose != 0) {
      uVar5 = 0x33;
      if (iVar2 == 0) {
        uVar5 = 0x20;
      }
      pcVar4 = "enc";
      if (uVar3 == 0) {
        pcVar4 = "dec";
      }
      printf("  DES%c-ECB-%3d (%s): ",uVar5,(ulong)(iVar2 * 0x38 + 0x38),pcVar4);
    }
    builtin_memcpy(prv,"Now is t",8);
    switch(u) {
    case 0:
      mbedtls_des_setkey_dec((mbedtls_des_context *)(ctx3.sk + 0x5e),des3_test_keys);
      break;
    case 1:
      mbedtls_des_setkey_enc((mbedtls_des_context *)(ctx3.sk + 0x5e),des3_test_keys);
      break;
    case 2:
      mbedtls_des3_set2key_dec((mbedtls_des3_context *)(buf + 4),des3_test_keys);
      break;
    case 3:
      mbedtls_des3_set2key_enc((mbedtls_des3_context *)(buf + 4),des3_test_keys);
      break;
    case 4:
      mbedtls_des3_set3key_dec((mbedtls_des3_context *)(buf + 4),des3_test_keys);
      break;
    case 5:
      mbedtls_des3_set3key_enc((mbedtls_des3_context *)(buf + 4),des3_test_keys);
      break;
    default:
      return 1;
    }
    for (v = 0; v < 10000; v = v + 1) {
      if (iVar2 == 0) {
        mbedtls_des_crypt_ecb((mbedtls_des_context *)(ctx3.sk + 0x5e),prv,prv);
      }
      else {
        mbedtls_des3_crypt_ecb((mbedtls_des3_context *)(buf + 4),prv,prv);
      }
    }
    if (((uVar3 == 0) && (prv != des3_test_ecb_dec[iVar2])) ||
       ((uVar3 != 0 && (prv != des3_test_ecb_enc[iVar2])))) {
      if (verbose != 0) {
        printf("failed\n");
      }
      ctx.sk[0x1e] = 1;
      goto LAB_00198fab;
    }
    if (verbose != 0) {
      printf("passed\n");
    }
  }
  if (verbose != 0) {
    printf(anon_var_dwarf_72b5b + 8);
  }
  u = 0;
  do {
    if (5 < u) {
      if (verbose != 0) {
        printf(anon_var_dwarf_72b5b + 8);
      }
LAB_00198fab:
      mbedtls_des_free((mbedtls_des_context *)(ctx3.sk + 0x5e));
      mbedtls_des3_free((mbedtls_des3_context *)(buf + 4));
      return ctx.sk[0x1e];
    }
    iVar2 = u >> 1;
    uVar3 = u & 1;
    if (verbose != 0) {
      uVar5 = 0x33;
      if (iVar2 == 0) {
        uVar5 = 0x20;
      }
      pcVar4 = "enc";
      if (uVar3 == 0) {
        pcVar4 = "dec";
      }
      printf("  DES%c-CBC-%3d (%s): ",uVar5,(ulong)(iVar2 * 0x38 + 0x38),pcVar4);
    }
    tmp[0] = '\x12';
    tmp[1] = '4';
    tmp[2] = 'V';
    tmp[3] = 'x';
    tmp[4] = 0x90;
    tmp[5] = 0xab;
    tmp[6] = 0xcd;
    tmp[7] = 0xef;
    iv[0] = '\x12';
    iv[1] = '4';
    iv[2] = 'V';
    iv[3] = 'x';
    iv[4] = 0x90;
    iv[5] = 0xab;
    iv[6] = 0xcd;
    iv[7] = 0xef;
    builtin_memcpy(prv,"Now is t",8);
    switch(u) {
    case 0:
      mbedtls_des_setkey_dec((mbedtls_des_context *)(ctx3.sk + 0x5e),des3_test_keys);
      break;
    case 1:
      mbedtls_des_setkey_enc((mbedtls_des_context *)(ctx3.sk + 0x5e),des3_test_keys);
      break;
    case 2:
      mbedtls_des3_set2key_dec((mbedtls_des3_context *)(buf + 4),des3_test_keys);
      break;
    case 3:
      mbedtls_des3_set2key_enc((mbedtls_des3_context *)(buf + 4),des3_test_keys);
      break;
    case 4:
      mbedtls_des3_set3key_dec((mbedtls_des3_context *)(buf + 4),des3_test_keys);
      break;
    case 5:
      mbedtls_des3_set3key_enc((mbedtls_des3_context *)(buf + 4),des3_test_keys);
      break;
    default:
      return 1;
    }
    if (uVar3 == 0) {
      for (v = 0; v < 10000; v = v + 1) {
        if (iVar2 == 0) {
          mbedtls_des_crypt_cbc((mbedtls_des_context *)(ctx3.sk + 0x5e),0,8,tmp,prv,prv);
        }
        else {
          mbedtls_des3_crypt_cbc((mbedtls_des3_context *)(buf + 4),0,8,tmp,prv,prv);
        }
      }
    }
    else {
      for (v = 0; v < 10000; v = v + 1) {
        if (iVar2 == 0) {
          mbedtls_des_crypt_cbc((mbedtls_des_context *)(ctx3.sk + 0x5e),uVar3,8,tmp,prv,prv);
        }
        else {
          mbedtls_des3_crypt_cbc((mbedtls_des3_context *)(buf + 4),uVar3,8,tmp,prv,prv);
        }
        auVar1[0] = prv[0];
        auVar1[1] = prv[1];
        auVar1[2] = prv[2];
        auVar1[3] = prv[3];
        auVar1[4] = prv[4];
        auVar1[5] = prv[5];
        auVar1[6] = prv[6];
        auVar1[7] = prv[7];
        prv[0] = iv[0];
        prv[1] = iv[1];
        prv[2] = iv[2];
        prv[3] = iv[3];
        prv[4] = iv[4];
        prv[5] = iv[5];
        prv[6] = iv[6];
        prv[7] = iv[7];
        iv = auVar1;
      }
      prv[0] = iv[0];
      prv[1] = iv[1];
      prv[2] = iv[2];
      prv[3] = iv[3];
      prv[4] = iv[4];
      prv[5] = iv[5];
      prv[6] = iv[6];
      prv[7] = iv[7];
    }
    if (((uVar3 == 0) && (prv != des3_test_cbc_dec[iVar2])) ||
       ((uVar3 != 0 && (prv != des3_test_cbc_enc[iVar2])))) {
      if (verbose != 0) {
        printf("failed\n");
      }
      ctx.sk[0x1e] = 1;
      goto LAB_00198fab;
    }
    if (verbose != 0) {
      printf("passed\n");
    }
    u = u + 1;
  } while( true );
}

Assistant:

int mbedtls_des_self_test( int verbose )
{
    int i, j, u, v, ret = 0;
    mbedtls_des_context ctx;
    mbedtls_des3_context ctx3;
    unsigned char buf[8];
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[8];
    unsigned char iv[8];
#endif

    mbedtls_des_init( &ctx );
    mbedtls_des3_init( &ctx3 );
    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  DES%c-ECB-%3d (%s): ",
                             ( u == 0 ) ? ' ' : '3', 56 + u * 56,
                             ( v == MBEDTLS_DES_DECRYPT ) ? "dec" : "enc" );

        memcpy( buf, des3_test_buf, 8 );

        switch( i )
        {
        case 0:
            mbedtls_des_setkey_dec( &ctx, des3_test_keys );
            break;

        case 1:
            mbedtls_des_setkey_enc( &ctx, des3_test_keys );
            break;

        case 2:
            mbedtls_des3_set2key_dec( &ctx3, des3_test_keys );
            break;

        case 3:
            mbedtls_des3_set2key_enc( &ctx3, des3_test_keys );
            break;

        case 4:
            mbedtls_des3_set3key_dec( &ctx3, des3_test_keys );
            break;

        case 5:
            mbedtls_des3_set3key_enc( &ctx3, des3_test_keys );
            break;

        default:
            return( 1 );
        }

        for( j = 0; j < 10000; j++ )
        {
            if( u == 0 )
                mbedtls_des_crypt_ecb( &ctx, buf, buf );
            else
                mbedtls_des3_crypt_ecb( &ctx3, buf, buf );
        }

        if( ( v == MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_ecb_dec[u], 8 ) != 0 ) ||
            ( v != MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_ecb_enc[u], 8 ) != 0 ) )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  DES%c-CBC-%3d (%s): ",
                             ( u == 0 ) ? ' ' : '3', 56 + u * 56,
                             ( v == MBEDTLS_DES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  des3_test_iv,  8 );
        memcpy( prv, des3_test_iv,  8 );
        memcpy( buf, des3_test_buf, 8 );

        switch( i )
        {
        case 0:
            mbedtls_des_setkey_dec( &ctx, des3_test_keys );
            break;

        case 1:
            mbedtls_des_setkey_enc( &ctx, des3_test_keys );
            break;

        case 2:
            mbedtls_des3_set2key_dec( &ctx3, des3_test_keys );
            break;

        case 3:
            mbedtls_des3_set2key_enc( &ctx3, des3_test_keys );
            break;

        case 4:
            mbedtls_des3_set3key_dec( &ctx3, des3_test_keys );
            break;

        case 5:
            mbedtls_des3_set3key_enc( &ctx3, des3_test_keys );
            break;

        default:
            return( 1 );
        }

        if( v == MBEDTLS_DES_DECRYPT )
        {
            for( j = 0; j < 10000; j++ )
            {
                if( u == 0 )
                    mbedtls_des_crypt_cbc( &ctx, v, 8, iv, buf, buf );
                else
                    mbedtls_des3_crypt_cbc( &ctx3, v, 8, iv, buf, buf );
            }
        }
        else
        {
            for( j = 0; j < 10000; j++ )
            {
                unsigned char tmp[8];

                if( u == 0 )
                    mbedtls_des_crypt_cbc( &ctx, v, 8, iv, buf, buf );
                else
                    mbedtls_des3_crypt_cbc( &ctx3, v, 8, iv, buf, buf );

                memcpy( tmp, prv, 8 );
                memcpy( prv, buf, 8 );
                memcpy( buf, tmp, 8 );
            }

            memcpy( buf, prv, 8 );
        }

        if( ( v == MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_cbc_dec[u], 8 ) != 0 ) ||
            ( v != MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_cbc_enc[u], 8 ) != 0 ) )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_des_free( &ctx );
    mbedtls_des3_free( &ctx3 );

    return( ret );
}